

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushFont(ImFont *font)

{
  int *piVar1;
  int iVar2;
  ImFontAtlas *pIVar3;
  ImFont **ppIVar4;
  ImGuiContext *pIVar5;
  ImFont **__dest;
  int iVar6;
  int iVar7;
  
  pIVar5 = GImGui;
  if ((font == (ImFont *)0x0) && (font = (GImGui->IO).FontDefault, font == (ImFont *)0x0)) {
    pIVar3 = (GImGui->IO).Fonts;
    if ((pIVar3->Fonts).Size < 1) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68b,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
    }
    font = *(pIVar3->Fonts).Data;
  }
  SetCurrentFont(font);
  iVar7 = (pIVar5->FontStack).Size;
  iVar2 = (pIVar5->FontStack).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImFont **)(*GImAllocatorAllocFunc)((long)iVar7 << 3,GImAllocatorUserData);
      ppIVar4 = (pIVar5->FontStack).Data;
      if (ppIVar4 != (ImFont **)0x0) {
        memcpy(__dest,ppIVar4,(long)(pIVar5->FontStack).Size << 3);
        ppIVar4 = (pIVar5->FontStack).Data;
        if ((ppIVar4 != (ImFont **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar5->FontStack).Data = __dest;
      (pIVar5->FontStack).Capacity = iVar7;
    }
  }
  (pIVar5->FontStack).Data[(pIVar5->FontStack).Size] = font;
  (pIVar5->FontStack).Size = (pIVar5->FontStack).Size + 1;
  ImDrawList::PushTextureID(pIVar5->CurrentWindow->DrawList,font->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}